

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

endpoint * __thiscall
libtorrent::aux::session_impl::bind_outgoing_socket
          (endpoint *__return_storage_ptr__,session_impl *this,socket_type *s,
          address *remote_address,error_code *ec)

{
  byte bVar1;
  io_context *this_00;
  undefined8 this_01;
  bool bVar2;
  bool bVar3;
  unsigned_short uVar4;
  int iVar5;
  base *__ptr;
  add_pointer_t<libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_> ptVar6;
  ssl_stream<libtorrent::aux::utp_stream> *this_02;
  next_layer_type *this_03;
  utp_stream *this_04;
  ulong uVar7;
  reference pvVar8;
  element_type *peVar9;
  error_category *cat;
  size_type sVar10;
  tcp *protocol;
  socklen_t __len;
  address *paVar11;
  error_code *in_stack_fffffffffffffdc0;
  bool local_1f1;
  address_v4 local_1c4;
  address local_1c0;
  address_v6 local_1a0;
  address local_188;
  address local_168;
  tcp local_148;
  undefined1 local_144 [44];
  string *ifname;
  address local_110;
  undefined1 local_ea;
  undefined1 local_e9;
  bitfield_flag local_e8 [3];
  bitfield_flag local_e5 [20];
  bitfield_flag local_d1 [9];
  shared_ptr<libtorrent::aux::listen_socket_t> *ls;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
  *__range3;
  shared_ptr<libtorrent::aux::listen_socket_t> match;
  vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
  with_gateways;
  undefined8 uStack_80;
  transport ssl;
  utp_socket_impl *impl;
  address local_70;
  undefined1 local_4c [8];
  endpoint bind_ep;
  error_code *ec_local;
  address *remote_address_local;
  socket_type *s_local;
  session_impl *this_local;
  
  paVar11 = remote_address;
  bind_ep.impl_.data_._20_8_ = ec;
  boost::asio::ip::address_v4::address_v4((address_v4 *)((long)&impl + 4));
  __len = (socklen_t)paVar11;
  boost::asio::ip::address::address(&local_70,(address_v4 *)((long)&impl + 4));
  boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
            ((basic_endpoint<boost::asio::ip::tcp> *)local_4c,&local_70,0);
  iVar5 = session_settings::get_int(&this->m_settings,0x4026);
  if (0 < iVar5) {
    boost::asio::detail::socket_option::boolean<1,_2>::boolean((boolean<1,_2> *)&impl,true);
    polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,libtorrent::socks5_stream,libtorrent::aux::http_stream,libtorrent::aux::utp_stream,libtorrent::i2p_stream,libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>>,libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>>
    ::set_option<boost::asio::detail::socket_option::boolean<1,2>>
              ((polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,libtorrent::socks5_stream,libtorrent::aux::http_stream,libtorrent::aux::utp_stream,libtorrent::i2p_stream,libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>>,libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>>
                *)s,(boolean<1,_2> *)&impl,(error_code *)bind_ep.impl_.data_._20_8_);
    boost::system::error_code::clear((error_code *)bind_ep.impl_.data_._20_8_);
    iVar5 = next_port(this);
    boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::port
              ((basic_endpoint<boost::asio::ip::tcp> *)local_4c,(unsigned_short)iVar5);
  }
  bVar2 = is_utp(s);
  if (bVar2) {
    __ptr = polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
            ::var(s);
    ptVar6 = ::std::
             get_if<libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>,libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,libtorrent::socks5_stream,libtorrent::aux::http_stream,libtorrent::aux::utp_stream,libtorrent::i2p_stream,libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>>,libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>>
                       (__ptr);
    if (ptVar6 == (add_pointer_t<libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>)0x0) {
      this_04 = ::std::
                get<libtorrent::aux::utp_stream,libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,libtorrent::socks5_stream,libtorrent::aux::http_stream,libtorrent::aux::utp_stream,libtorrent::i2p_stream,libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>>,libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>>
                          (&s->
                            super_variant<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                          );
      uStack_80 = utp_stream::get_impl(this_04);
    }
    else {
      this_02 = ::std::
                get<libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>,libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,libtorrent::socks5_stream,libtorrent::aux::http_stream,libtorrent::aux::utp_stream,libtorrent::i2p_stream,libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>>,libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>>
                          (&s->
                            super_variant<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                          );
      this_03 = ssl_stream<libtorrent::aux::utp_stream>::next_layer(this_02);
      uStack_80 = utp_stream::get_impl(this_03);
    }
    with_gateways.
    super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ =
         ptVar6 != (add_pointer_t<libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>)0x0;
    ::std::
    vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
    ::vector((vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
              *)&match.
                 super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount);
    ::std::shared_ptr<libtorrent::aux::listen_socket_t>::shared_ptr
              ((shared_ptr<libtorrent::aux::listen_socket_t> *)&__range3);
    __end3 = ::std::
             vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
             ::begin(&this->m_listen_sockets);
    ls = (shared_ptr<libtorrent::aux::listen_socket_t> *)
         ::std::
         vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
         ::end(&this->m_listen_sockets);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
                                       *)&ls), bVar2) {
      local_d1._1_8_ =
           __gnu_cxx::
           __normal_iterator<const_std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
           ::operator*(&__end3);
      peVar9 = ::std::
               __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_d1._1_8_);
      local_e5[0x13] = (bitfield_flag)(peVar9->flags).m_val;
      local_e5[0x12] = (bitfield_flag)0x8;
      local_d1[0] = (bitfield_flag)
                    libtorrent::flags::operator&
                              ((bitfield_flag<unsigned_char,_libtorrent::aux::listen_socket_flags_tag,_void>
                                )local_e5[0x13],
                               (bitfield_flag<unsigned_char,_libtorrent::aux::listen_socket_flags_tag,_void>
                                )0x8);
      bVar3 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(local_d1);
      bVar2 = false;
      if (!bVar3) {
        peVar9 = ::std::
                 __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_d1._1_8_);
        bVar2 = is_v4<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>
                          (&peVar9->local_endpoint);
        bVar3 = boost::asio::ip::address::is_v4(remote_address);
        bVar2 = bVar2 != bVar3;
      }
      if ((!bVar2) &&
         (peVar9 = ::std::
                   __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_d1._1_8_),
         (bool)peVar9->ssl ==
         with_gateways.
         super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_)) {
        peVar9 = ::std::
                 __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_d1._1_8_);
        local_e8[2] = (bitfield_flag)(peVar9->flags).m_val;
        local_e8[1] = (bitfield_flag)0x2;
        local_e5[0] = (bitfield_flag)
                      libtorrent::flags::operator&
                                ((bitfield_flag<unsigned_char,_libtorrent::aux::listen_socket_flags_tag,_void>
                                  )local_e8[2],
                                 (bitfield_flag<unsigned_char,_libtorrent::aux::listen_socket_flags_tag,_void>
                                  )0x2);
        bVar2 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(local_e5);
        if (((bVar2 ^ 0xffU) & 1) != 0) {
          ::std::
          vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
          ::push_back((vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
                       *)&match.
                          super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount,(value_type *)local_d1._1_8_);
        }
        peVar9 = ::std::
                 __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_d1._1_8_);
        local_e9 = (peVar9->flags).m_val;
        local_ea = 8;
        local_e8[0] = (bitfield_flag)
                      libtorrent::flags::operator&
                                ((bitfield_flag<unsigned_char,_libtorrent::aux::listen_socket_flags_tag,_void>
                                  )local_e9,
                                 (bitfield_flag<unsigned_char,_libtorrent::aux::listen_socket_flags_tag,_void>
                                  )0x8);
        bVar2 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(local_e8);
        local_1f1 = true;
        if (!bVar2) {
          peVar9 = ::std::
                   __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_d1._1_8_);
          boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address
                    (&local_110,&peVar9->local_endpoint);
          peVar9 = ::std::
                   __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_d1._1_8_);
          local_1f1 = match_addr_mask(&local_110,remote_address,&peVar9->netmask);
        }
        if (local_1f1 != false) {
          ::std::shared_ptr<libtorrent::aux::listen_socket_t>::operator=
                    ((shared_ptr<libtorrent::aux::listen_socket_t> *)&__range3,
                     (shared_ptr<libtorrent::aux::listen_socket_t> *)local_d1._1_8_);
        }
      }
      __gnu_cxx::
      __normal_iterator<const_std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
      ::operator++(&__end3);
    }
    bVar2 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&__range3);
    if ((!bVar2) &&
       (bVar2 = ::std::
                vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
                ::empty((vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
                         *)&match.
                            super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount), !bVar2)) {
      sVar10 = ::std::
               vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
               ::size((vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
                       *)&match.
                          super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount);
      uVar7 = random((aux *)(ulong)((int)sVar10 - 1));
      pvVar8 = ::std::
               vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
               ::operator[]((vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
                             *)&match.
                                super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount,uVar7 & 0xffffffff);
      ::std::shared_ptr<libtorrent::aux::listen_socket_t>::operator=
                ((shared_ptr<libtorrent::aux::listen_socket_t> *)&__range3,pvVar8);
    }
    bVar2 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&__range3);
    this_01 = bind_ep.impl_.data_._20_8_;
    if (bVar2) {
      ::std::weak_ptr<libtorrent::aux::utp_socket_interface>::operator=
                ((weak_ptr<libtorrent::aux::utp_socket_interface> *)uStack_80,
                 (shared_ptr<libtorrent::aux::listen_socket_t> *)&__range3);
      peVar9 = ::std::
               __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&__range3);
      boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
                (__return_storage_ptr__,&peVar9->local_endpoint);
    }
    else {
      cat = boost::system::generic_category();
      boost::system::error_code::assign((error_code *)this_01,0x5f,cat);
      boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint(__return_storage_ptr__);
    }
    ifname._4_4_ = 1;
    ::std::shared_ptr<libtorrent::aux::listen_socket_t>::~shared_ptr
              ((shared_ptr<libtorrent::aux::listen_socket_t> *)&__range3);
    ::std::
    vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
    ::~vector((vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
               *)&match.
                  super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
  }
  else {
    bVar2 = ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&this->m_outgoing_interfaces);
    if (bVar2) {
      boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address
                (&local_168,(basic_endpoint<boost::asio::ip::tcp> *)local_4c);
      bVar2 = boost::asio::ip::address::is_unspecified(&local_168);
      if (bVar2) {
        bVar2 = boost::asio::ip::address::is_v6(remote_address);
        if (bVar2) {
          boost::asio::ip::address_v6::any();
          boost::asio::ip::address::address(&local_188,&local_1a0);
          boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address
                    ((basic_endpoint<boost::asio::ip::tcp> *)local_4c,&local_188);
        }
        else {
          boost::asio::ip::address_v4::any();
          boost::asio::ip::address::address(&local_1c0,&local_1c4);
          boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address
                    ((basic_endpoint<boost::asio::ip::tcp> *)local_4c,&local_1c0);
        }
      }
      polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
      ::bind(s,(int)local_4c,(sockaddr *)bind_ep.impl_.data_._20_8_,__len);
      boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
                (__return_storage_ptr__,(basic_endpoint<boost::asio::ip::tcp> *)local_4c);
    }
    else {
      bVar1 = this->m_interface_index;
      sVar10 = ::std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size(&this->m_outgoing_interfaces);
      if (sVar10 <= bVar1) {
        this->m_interface_index = '\0';
      }
      bVar1 = this->m_interface_index;
      this->m_interface_index = bVar1 + 1;
      local_144._36_8_ =
           ::std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&this->m_outgoing_interfaces,(ulong)bVar1);
      this_00 = this->m_io_context;
      bVar2 = boost::asio::ip::address::is_v4(remote_address);
      if (bVar2) {
        local_148 = boost::asio::ip::tcp::v4();
      }
      else {
        local_148 = boost::asio::ip::tcp::v6();
      }
      tcp::tcp((tcp *)local_144,&local_148);
      protocol = (tcp *)::std::__cxx11::string::c_str();
      uVar4 = boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::port
                        ((basic_endpoint<boost::asio::ip::tcp> *)local_4c);
      bind_socket_to_device<libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,libtorrent::socks5_stream,libtorrent::aux::http_stream,libtorrent::aux::utp_stream,libtorrent::i2p_stream,libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>>,libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>>>
                ((address *)(local_144 + 4),(aux *)this_00,(io_context *)s,
                 (polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                  *)local_144,protocol,(char *)(ulong)uVar4,(int)bind_ep.impl_.data_._20_8_,
                 in_stack_fffffffffffffdc0);
      boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address
                ((basic_endpoint<boost::asio::ip::tcp> *)local_4c,(address *)(local_144 + 4));
      boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
                (__return_storage_ptr__,(basic_endpoint<boost::asio::ip::tcp> *)local_4c);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

tcp::endpoint session_impl::bind_outgoing_socket(socket_type& s
		, address const& remote_address, error_code& ec) const
	{
		tcp::endpoint bind_ep(address_v4(), 0);
		if (m_settings.get_int(settings_pack::outgoing_port) > 0)
		{
#ifdef TORRENT_WINDOWS
			s.set_option(exclusive_address_use(true), ec);
#else
			s.set_option(tcp::acceptor::reuse_address(true), ec);
#endif
			// ignore errors because the underlying socket may not
			// be opened yet. This happens when we're routing through
			// a proxy. In that case, we don't yet know the address of
			// the proxy server, and more importantly, we don't know
			// the address family of its address. This means we can't
			// open the socket yet. The socks abstraction layer defers
			// opening it.
			ec.clear();
			bind_ep.port(std::uint16_t(next_port()));
		}

		if (is_utp(s))
		{
			// TODO: factor out this logic into a separate function for unit
			// testing

			utp_socket_impl* impl = nullptr;
			transport ssl = transport::plaintext;
#if TORRENT_USE_SSL
			if (std::get_if<ssl_stream<utp_stream>>(&s.var()) != nullptr)
			{
				impl = std::get<ssl_stream<utp_stream>>(s).next_layer().get_impl();
				ssl = transport::ssl;
			}
			else
#endif
				impl = std::get<utp_stream>(s).get_impl();

			std::vector<std::shared_ptr<listen_socket_t>> with_gateways;
			std::shared_ptr<listen_socket_t> match;
			for (auto const& ls : m_listen_sockets)
			{
				// this is almost, but not quite, like can_route()
				if (!(ls->flags & listen_socket_t::proxy)
					&& is_v4(ls->local_endpoint) != remote_address.is_v4())
					continue;
				if (ls->ssl != ssl) continue;
				if (!(ls->flags & listen_socket_t::local_network))
					with_gateways.push_back(ls);

				if (ls->flags & listen_socket_t::proxy
					|| match_addr_mask(ls->local_endpoint.address(), remote_address, ls->netmask))
				{
					// is this better than the previous match?
					match = ls;
				}
			}
			if (!match && !with_gateways.empty())
				match = with_gateways[random(std::uint32_t(with_gateways.size() - 1))];

			if (match)
			{
				impl->m_sock = match;
				return match->local_endpoint;
			}
			ec.assign(boost::system::errc::not_supported, generic_category());
			return {};
		}

		if (!m_outgoing_interfaces.empty())
		{
			if (m_interface_index >= m_outgoing_interfaces.size()) m_interface_index = 0;
			std::string const& ifname = m_outgoing_interfaces[m_interface_index++];

			bind_ep.address(bind_socket_to_device(m_io_context, s
				, remote_address.is_v4() ? tcp::v4() : tcp::v6()
				, ifname.c_str(), bind_ep.port(), ec));
			return bind_ep;
		}

		// if we're not binding to a specific interface, bind
		// to the same protocol family as the target endpoint
		if (bind_ep.address().is_unspecified())
		{
			if (remote_address.is_v6())
				bind_ep.address(address_v6::any());
			else
				bind_ep.address(address_v4::any());
		}

		s.bind(bind_ep, ec);
		return bind_ep;
	}